

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

MediumHandle
pbrt::MediumHandle::Create
          (string *name,ParameterDictionary *parameters,Transform *renderFromMedium,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  NanoVDBMediumProvider *provider_2;
  CloudMediumProvider *provider_1;
  UniformGridMediumProvider *provider;
  MediumHandle *m;
  ParameterDictionary *in_stack_00000120;
  FileLoc *in_stack_00000130;
  ParameterDictionary *in_stack_00000138;
  Allocator in_stack_00000140;
  FileLoc *in_stack_000001b0;
  Transform *in_stack_000001b8;
  ParameterDictionary *in_stack_000001c0;
  UniformGridMediumProvider *in_stack_000001c8;
  Allocator in_stack_000001d0;
  FileLoc *in_stack_00000230;
  ParameterDictionary *in_stack_00000238;
  Allocator in_stack_00000240;
  FileLoc *in_stack_000002b0;
  ParameterDictionary *in_stack_000002b8;
  Allocator in_stack_000002c0;
  FileLoc *in_stack_000004c0;
  ParameterDictionary *in_stack_000004c8;
  Allocator in_stack_000004d0;
  GeneralMedium<pbrt::UniformGridMediumProvider> *in_stack_ffffffffffffff48;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  __lhs.bits = in_RDI.bits;
  TaggedPointer((MediumHandle *)in_RDI.bits,in_stack_ffffffffffffff48);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs.bits,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    HomogeneousMedium::Create(in_stack_00000238,in_stack_00000230,in_stack_00000240);
    TaggedPointer<pbrt::HomogeneousMedium>
              ((MediumHandle *)__lhs.bits,(HomogeneousMedium *)in_stack_ffffffffffffff48);
    operator=((MediumHandle *)__lhs.bits,(MediumHandle *)in_stack_ffffffffffffff48);
    in_R9 = in_stack_ffffffffffffff80;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs.bits,(char *)in_stack_ffffffffffffff48);
    if (bVar1) {
      UniformGridMediumProvider::Create(in_stack_000004c8,in_stack_000004c0,in_stack_000004d0);
      GeneralMedium<pbrt::UniformGridMediumProvider>::Create
                (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                 in_stack_000001d0);
      TaggedPointer<pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>>
                ((MediumHandle *)__lhs.bits,in_stack_ffffffffffffff48);
      operator=((MediumHandle *)__lhs.bits,(MediumHandle *)in_stack_ffffffffffffff48);
      in_R9 = in_stack_ffffffffffffff80;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs.bits,(char *)in_stack_ffffffffffffff48);
      if (bVar1) {
        in_stack_ffffffffffffff90 = in_R9;
        CloudMediumProvider::Create(in_stack_00000138,in_stack_00000130,in_stack_00000140);
        GeneralMedium<pbrt::CloudMediumProvider>::Create
                  ((CloudMediumProvider *)in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                   in_stack_000001b0,in_stack_000001d0);
        TaggedPointer<pbrt::GeneralMedium<pbrt::CloudMediumProvider>>
                  ((MediumHandle *)__lhs.bits,
                   (GeneralMedium<pbrt::CloudMediumProvider> *)in_stack_ffffffffffffff48);
        operator=((MediumHandle *)__lhs.bits,(MediumHandle *)in_stack_ffffffffffffff48);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs.bits,(char *)in_stack_ffffffffffffff48);
        if (!bVar1) {
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff80);
        }
        NanoVDBMediumProvider::Create(in_stack_000002b8,in_stack_000002b0,in_stack_000002c0);
        GeneralMedium<pbrt::NanoVDBMediumProvider>::Create
                  ((NanoVDBMediumProvider *)in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                   in_stack_000001b0,in_stack_000001d0);
        TaggedPointer<pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>>
                  ((MediumHandle *)__lhs.bits,
                   (GeneralMedium<pbrt::NanoVDBMediumProvider> *)in_stack_ffffffffffffff48);
        operator=((MediumHandle *)__lhs.bits,(MediumHandle *)in_stack_ffffffffffffff48);
        in_R9 = in_stack_ffffffffffffff80;
      }
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)__lhs.bits);
  if (bVar1) {
    ParameterDictionary::ReportUnused(in_stack_00000120);
    return (MediumHandle)
           (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            )in_RDI.bits;
  }
  ErrorExit<std::__cxx11::string_const&>
            ((FileLoc *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_R9);
}

Assistant:

MediumHandle MediumHandle::Create(const std::string &name,
                                  const ParameterDictionary &parameters,
                                  const Transform &renderFromMedium, const FileLoc *loc,
                                  Allocator alloc) {
    MediumHandle m = nullptr;
    if (name == "homogeneous")
        m = HomogeneousMedium::Create(parameters, loc, alloc);
    else if (name == "uniformgrid") {
        UniformGridMediumProvider *provider =
            UniformGridMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<UniformGridMediumProvider>::Create(
            provider, parameters, renderFromMedium, loc, alloc);
    } else if (name == "cloud") {
        CloudMediumProvider *provider =
            CloudMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<CloudMediumProvider>::Create(provider, parameters,
                                                       renderFromMedium, loc, alloc);
    } else if (name == "nanovdb") {
        NanoVDBMediumProvider *provider =
            NanoVDBMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<NanoVDBMediumProvider>::Create(provider, parameters,
                                                         renderFromMedium, loc, alloc);
    } else
        ErrorExit(loc, "%s: medium unknown.", name);

    if (!m)
        ErrorExit(loc, "%s: unable to create medium.", name);

    parameters.ReportUnused();
    return m;
}